

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

Symbol * slang::ast::anon_unknown_39::getContainingPackage(Symbol *symbol)

{
  Symbol *curr;
  
  while( true ) {
    if (symbol->kind == InstanceBody) {
      return (Symbol *)0x0;
    }
    if (symbol->kind == Package) break;
    if (symbol->parentScope == (Scope *)0x0) {
      return (Symbol *)0x0;
    }
    symbol = symbol->parentScope->thisSym;
  }
  return symbol;
}

Assistant:

const Symbol* getContainingPackage(const Symbol& symbol) {
    auto curr = &symbol;
    while (true) {
        if (curr->kind == SymbolKind::Package)
            return curr;

        if (curr->kind == SymbolKind::InstanceBody)
            return nullptr;

        auto scope = curr->getParentScope();
        if (!scope)
            return nullptr;

        curr = &scope->asSymbol();
    }
}